

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_ArgOut_A<Js::OpLayoutDynamicProfile<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_>
          *playout)

{
  ValidateRegValue(this,*(Var *)(this + (ulong)(playout->
                                               super_OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>
                                               ).Reg * 8 + 0x160),false,true);
}

Assistant:

void InterpreterStackFrame::OP_ArgOut_A(const unaligned T * playout)
    {
        SetOut(playout->Arg, GetReg(playout->Reg));
    }